

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntCooperativeVectorNVType
          (ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t id_00;
  Instruction *this_00;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  bVar1 = IsCooperativeVectorNVType(this,id);
  if (bVar1) {
    this_00 = FindDef(this,id);
    id_00 = val::Instruction::word(this_00,2);
    this_local._7_1_ = IsUnsignedIntScalarType(this,id_00);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::IsUnsignedIntCooperativeVectorNVType(
    uint32_t id) const {
  if (!IsCooperativeVectorNVType(id)) return false;
  return IsUnsignedIntScalarType(FindDef(id)->word(2));
}